

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

bool __thiscall QAction::event(QAction *this,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QActionPrivate *pQVar4;
  QObject **ppQVar5;
  char *pcVar6;
  QShortcutEvent *in_RSI;
  QList<QObject_*> *in_RDI;
  long in_FS_OFFSET;
  QShortcutEvent *se;
  QObject *object;
  add_const_t<QList<QObject_*>_> *__range2;
  QActionPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QObject *in_stack_ffffffffffffff60;
  QObjectList *in_stack_ffffffffffffff68;
  QList<QObject_*> *pQVar7;
  SequenceFormat format;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  char local_40 [32];
  QObject **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = in_RDI;
  pQVar4 = d_func((QAction *)0x977385);
  TVar3 = QEvent::type(&in_RSI->super_QEvent);
  format = (SequenceFormat)((ulong)pQVar7 >> 0x20);
  if (TVar3 == ActionChanged) {
    in_stack_ffffffffffffff68 = &pQVar4->associatedObjects;
    local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QObject_*>::begin(in_RDI);
    local_18.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QObject_*>::end(in_RDI);
    while( true ) {
      local_20 = local_18.i;
      bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,local_18);
      format = (SequenceFormat)((ulong)pQVar7 >> 0x20);
      if (!bVar1) break;
      ppQVar5 = QList<QObject_*>::const_iterator::operator*(&local_10);
      in_stack_ffffffffffffff60 = *ppQVar5;
      QCoreApplication::sendEvent((QObject *)in_stack_ffffffffffffff60,(QEvent *)in_RSI);
      QList<QObject_*>::const_iterator::operator++(&local_10);
    }
  }
  TVar3 = QEvent::type(&in_RSI->super_QEvent);
  if (TVar3 == Shortcut) {
    bVar1 = QShortcutEvent::isAmbiguous(in_RSI);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff60,(char *)in_RSI,
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      QShortcutEvent::key(in_RSI);
      QKeySequence::toString
                ((QKeySequence *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 format);
      QString::toLatin1((QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      pcVar6 = QByteArray::constData((QByteArray *)0x9774d0);
      QMessageLogger::warning(local_40,"QAction::event: Ambiguous shortcut overload: %s",pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x9774f0);
      QString::~QString((QString *)0x9774fa);
    }
    else {
      activate((QAction *)in_stack_ffffffffffffff68,
               (ActionEvent)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    bVar1 = true;
  }
  else {
    bVar2 = QObject::event((QEvent *)in_RDI);
    bVar1 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QAction::event(QEvent *e)
{
    Q_D(QAction);
    if (e->type() == QEvent::ActionChanged) {
        for (auto object : std::as_const(d->associatedObjects))
            QCoreApplication::sendEvent(object, e);
    }

#if QT_CONFIG(shortcut)
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        Q_ASSERT_X(d_func()->shortcutIds.contains(se->shortcutId()),
                   "QAction::event",
                   "Received shortcut event from incorrect shortcut");
        if (se->isAmbiguous())
            qWarning("QAction::event: Ambiguous shortcut overload: %s", se->key().toString(QKeySequence::NativeText).toLatin1().constData());
        else
            activate(Trigger);
        return true;
    }
#endif // QT_CONFIG(shortcut)
    return QObject::event(e);
}